

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnTableCopyExpr
          (BinaryReaderIR *this,Index dst_index,Index src_index)

{
  Index index;
  Location local_100;
  Var local_e0;
  Location local_98;
  Var local_78;
  unique_ptr<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>_> local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  Index local_20;
  Index local_1c;
  Index src_index_local;
  Index dst_index_local;
  BinaryReaderIR *this_local;
  
  local_20 = src_index;
  local_1c = dst_index;
  _src_index_local = this;
  Location::Location(&local_98);
  Var::Var(&local_78,dst_index,&local_98);
  index = local_20;
  Location::Location(&local_100);
  Var::Var(&local_e0,index,&local_100);
  MakeUnique<wabt::TableCopyExpr,wabt::Var,wabt::Var>((wabt *)&local_30,&local_78,&local_e0);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::TableCopyExpr,std::default_delete<wabt::TableCopyExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,&local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::unique_ptr<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>_>::~unique_ptr
            (&local_30);
  Var::~Var(&local_e0);
  Var::~Var(&local_78);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnTableCopyExpr(Index dst_index, Index src_index) {
  return AppendExpr(MakeUnique<TableCopyExpr>(Var(dst_index), Var(src_index)));
}